

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

decNumber *
decCompareOp(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint8_t op,
            uint32_t *status)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  uint in_EAX;
  uint uVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  int32_t residue;
  undefined8 uStack_38;
  
  bVar8 = lhs->bits;
  if ((int)CONCAT71(in_register_00000081,op) != 4) {
    bVar10 = rhs->bits;
LAB_0023dad0:
    uStack_38._0_4_ = in_EAX;
    if (((bVar8 | bVar10) & 0x30) == 0) {
      uVar6 = decCompare(lhs,rhs,(byte)(op - 7) < 2);
    }
    else {
      if (op == '\x01') {
LAB_0023daf0:
        decNaNs(res,lhs,rhs,set,status);
        return res;
      }
      if (op == '\x06') {
        *status = *status | 0x40000080;
        goto LAB_0023daf0;
      }
      if (op != '\x04') {
        if ((((bVar8 | bVar10) & 0x10) != 0) || (((bVar8 & 0x30) != 0 && ((bVar10 & 0x30) != 0))))
        goto LAB_0023daf0;
        uVar6 = -(bVar8 >> 5 & 1) | 1;
        uStack_38 = (ulong)in_EAX;
        goto LAB_0023dd2d;
      }
      uVar9 = 0xffffffff;
      if ((bVar8 & 0x30) != 0) {
        if ((bVar10 & 0x30) != 0) {
          if (((bVar8 & 0x10) != 0) && ((bVar10 & 0x20) != 0)) goto LAB_0023dba4;
          if (((bVar8 & 0x20) == 0) || ((bVar10 & 0x10) == 0)) {
            uVar6 = lhs->digits;
            if ((long)(int)uVar6 < 0x32) {
              uVar6 = (uint)""[(int)uVar6];
            }
            uVar11 = rhs->digits;
            if ((long)(int)uVar11 < 0x32) {
              uVar11 = (uint)""[(int)uVar11];
            }
            if (uVar6 <= uVar11) {
              if (uVar11 <= uVar6) {
                lVar7 = (ulong)uVar6 + 9;
                do {
                  if (lVar7 < 10) {
                    uVar9 = 0;
                    break;
                  }
                  lVar4 = lVar7 + -10;
                  lVar5 = lVar7 + -10;
                  if (rhs->lsu[lVar5] < lhs->lsu[lVar4]) goto LAB_0023db9f;
                  lVar7 = lVar7 + -1;
                } while (rhs->lsu[lVar5] <= lhs->lsu[lVar4]);
              }
              goto LAB_0023dba4;
            }
          }
        }
LAB_0023db9f:
        uVar9 = 1;
      }
LAB_0023dba4:
      uVar6 = -uVar9;
      if (-1 < (char)bVar8) {
        uVar6 = uVar9;
      }
    }
    switch(op) {
    case '\x01':
    case '\x04':
    case '\x06':
      goto switchD_0023dbcb_caseD_1;
    default:
      uStack_38 = (ulong)(uint)uStack_38;
      if (uVar6 == 0) {
        bVar8 = lhs->bits & 0x80;
        if (bVar8 == (rhs->bits & 0x80)) {
          if ((char)(rhs->bits & lhs->bits) < '\0') {
            bVar3 = lhs->exponent < rhs->exponent;
          }
          else {
            bVar3 = rhs->exponent < lhs->exponent;
          }
          uVar6 = (uint)bVar3 * 2 - 1;
        }
        else {
          uVar6 = -(uint)(bVar8 != 0) | 1;
        }
      }
      if ((op == '\b') || (op == '\x03')) {
        uVar6 = -uVar6;
      }
LAB_0023dd2d:
      if (0 < (int)uVar6) {
        rhs = lhs;
      }
      res->bits = rhs->bits;
      res->exponent = rhs->exponent;
      decSetCoeff(res,set,rhs->lsu,rhs->digits,(int32_t *)((long)&uStack_38 + 4),status);
      decFinalize(res,set,(int32_t *)((long)&uStack_38 + 4),status);
      return res;
    case '\x05':
      return res;
    }
  }
  bVar10 = rhs->bits;
  if ((char)bVar8 < '\0') {
    uVar6 = 0xffffffff;
    if ((char)bVar10 < '\0') goto LAB_0023dad0;
  }
  else {
    if (-1 < (char)bVar10) goto LAB_0023dad0;
    uVar6 = 1;
  }
  goto LAB_0023dcab;
switchD_0023dbcb_caseD_1:
  if ((op != '\x04') || (uVar6 != 0)) {
    res->bits = '\0';
    res->lsu[0] = '\0';
    res->digits = 1;
    res->exponent = 0;
    if (uVar6 == 0) {
      return res;
    }
    goto LAB_0023dcba;
  }
  iVar1 = rhs->exponent;
  iVar2 = lhs->exponent;
  if (iVar2 == iVar1) {
    res->bits = '\0';
    res->lsu[0] = '\0';
    res->digits = 1;
    res->exponent = 0;
    return res;
  }
  uVar6 = (uint)(iVar1 <= iVar2) * -2 + 1;
  if (-1 < (char)lhs->bits) {
    uVar6 = (uint)(iVar1 <= iVar2) * 2 - 1;
  }
LAB_0023dcab:
  res->bits = '\0';
  res->digits = 1;
  res->exponent = 0;
LAB_0023dcba:
  res->lsu[0] = '\x01';
  if ((int)uVar6 < 0) {
    res->bits = 0x80;
  }
  return res;
}

Assistant:

static decNumber * decCompareOp(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set,
                         Flag op, uInt *status) {
  #if DECSUBSET
  decNumber *alloclhs=NULL;        /* non-NULL if rounded lhs allocated  */
  decNumber *allocrhs=NULL;        /* .., rhs  */
  #endif
  Int   result=0;                  /* default result value  */
  uByte merged;                    /* work  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                             /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operands and set lostDigits status, as needed  */
      if (lhs->digits>set->digits) {
        alloclhs=decRoundOperand(lhs, set, status);
        if (alloclhs==NULL) {result=BADINT; break;}
        lhs=alloclhs;
        }
      if (rhs->digits>set->digits) {
        allocrhs=decRoundOperand(rhs, set, status);
        if (allocrhs==NULL) {result=BADINT; break;}
        rhs=allocrhs;
        }
      }
    #endif
    /* [following code does not require input rounding]  */

    /* If total ordering then handle differing signs 'up front'  */
    if (op==COMPTOTAL) {                /* total ordering  */
      if (decNumberIsNegative(lhs) && !decNumberIsNegative(rhs)) {
        result=-1;
        break;
        }
      if (!decNumberIsNegative(lhs) && decNumberIsNegative(rhs)) {
        result=+1;
        break;
        }
      }

    /* handle NaNs specially; let infinities drop through  */
    /* This assumes sNaN (even just one) leads to NaN.  */
    merged=(lhs->bits | rhs->bits) & (DECSNAN | DECNAN);
    if (merged) {                       /* a NaN bit set  */
      if (op==COMPARE);                 /* result will be NaN  */
       else if (op==COMPSIG)            /* treat qNaN as sNaN  */
        *status|=DEC_Invalid_operation | DEC_sNaN;
       else if (op==COMPTOTAL) {        /* total ordering, always finite  */
        /* signs are known to be the same; compute the ordering here  */
        /* as if the signs are both positive, then invert for negatives  */
        if (!decNumberIsNaN(lhs)) result=-1;
         else if (!decNumberIsNaN(rhs)) result=+1;
         /* here if both NaNs  */
         else if (decNumberIsSNaN(lhs) && decNumberIsQNaN(rhs)) result=-1;
         else if (decNumberIsQNaN(lhs) && decNumberIsSNaN(rhs)) result=+1;
         else { /* both NaN or both sNaN  */
          /* now it just depends on the payload  */
          result=decUnitCompare(lhs->lsu, D2U(lhs->digits),
                                rhs->lsu, D2U(rhs->digits), 0);
          /* [Error not possible, as these are 'aligned']  */
          } /* both same NaNs  */
        if (decNumberIsNegative(lhs)) result=-result;
        break;
        } /* total order  */

       else if (merged & DECSNAN);           /* sNaN -> qNaN  */
       else { /* here if MIN or MAX and one or two quiet NaNs  */
        /* min or max -- 754 rules ignore single NaN  */
        if (!decNumberIsNaN(lhs) || !decNumberIsNaN(rhs)) {
          /* just one NaN; force choice to be the non-NaN operand  */
          op=COMPMAX;
          if (lhs->bits & DECNAN) result=-1; /* pick rhs  */
                             else result=+1; /* pick lhs  */
          break;
          }
        } /* max or min  */
      op=COMPNAN;                            /* use special path  */
      decNaNs(res, lhs, rhs, set, status);   /* propagate NaN  */
      break;
      }
    /* have numbers  */
    if (op==COMPMAXMAG || op==COMPMINMAG) result=decCompare(lhs, rhs, 1);
     else result=decCompare(lhs, rhs, 0);    /* sign matters  */
    } while(0);                              /* end protected  */

  if (result==BADINT) *status|=DEC_Insufficient_storage; /* rare  */
   else {
    if (op==COMPARE || op==COMPSIG ||op==COMPTOTAL) { /* returning signum  */
      if (op==COMPTOTAL && result==0) {
        /* operands are numerically equal or same NaN (and same sign,  */
        /* tested first); if identical, leave result 0  */
        if (lhs->exponent!=rhs->exponent) {
          if (lhs->exponent<rhs->exponent) result=-1;
           else result=+1;
          if (decNumberIsNegative(lhs)) result=-result;
          } /* lexp!=rexp  */
        } /* total-order by exponent  */
      uprv_decNumberZero(res);               /* [always a valid result]  */
      if (result!=0) {                  /* must be -1 or +1  */
        *res->lsu=1;
        if (result<0) res->bits=DECNEG;
        }
      }
     else if (op==COMPNAN);             /* special, drop through  */
     else {                             /* MAX or MIN, non-NaN result  */
      Int residue=0;                    /* rounding accumulator  */
      /* choose the operand for the result  */
      const decNumber *choice;
      if (result==0) { /* operands are numerically equal  */
        /* choose according to sign then exponent (see 754)  */
        uByte slhs=(lhs->bits & DECNEG);
        uByte srhs=(rhs->bits & DECNEG);
        #if DECSUBSET
        if (!set->extended) {           /* subset: force left-hand  */
          op=COMPMAX;
          result=+1;
          }
        else
        #endif
        if (slhs!=srhs) {          /* signs differ  */
          if (slhs) result=-1;     /* rhs is max  */
               else result=+1;     /* lhs is max  */
          }
         else if (slhs && srhs) {  /* both negative  */
          if (lhs->exponent<rhs->exponent) result=+1;
                                      else result=-1;
          /* [if equal, use lhs, technically identical]  */
          }
         else {                    /* both positive  */
          if (lhs->exponent>rhs->exponent) result=+1;
                                      else result=-1;
          /* [ditto]  */
          }
        } /* numerically equal  */
      /* here result will be non-0; reverse if looking for MIN  */
      if (op==COMPMIN || op==COMPMINMAG) result=-result;
      choice=(result>0 ? lhs : rhs);    /* choose  */
      /* copy chosen to result, rounding if need be  */
      decCopyFit(res, choice, set, &residue, status);
      decFinish(res, set, &residue, status);
      }
    }
  #if DECSUBSET
  if (allocrhs!=NULL) free(allocrhs);   /* free any storage used  */
  if (alloclhs!=NULL) free(alloclhs);   /* ..  */
  #endif
  return res;
  }